

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O2

ssize_t __thiscall LASinterval::read(LASinterval *this,int __fd,void *__buf,size_t __nbytes)

{
  LASintervalStartCell *this_00;
  LASintervalStartCell *this_01;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  long *plVar2;
  LASintervalStartCell *pLVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_int,_LASintervalStartCell_*>,_false,_false>,_bool>
  pVar4;
  U32 number_cells;
  char signature [4];
  U32 number_points;
  I32 cell_index;
  U32 number_intervals;
  LASintervalStartCell *local_40;
  U32 version;
  
  plVar2 = (long *)CONCAT44(in_register_00000034,__fd);
  (**(code **)(*plVar2 + 8))(plVar2,signature,4);
  if (signature == (char  [4])0x5653414c) {
    (**(code **)(*plVar2 + 0x18))(plVar2,&version);
    (**(code **)(*plVar2 + 0x18))(plVar2,&number_cells);
LAB_00124ba1:
    if (number_cells != 0) {
      (**(code **)(*plVar2 + 0x18))(plVar2,&cell_index);
      this_00 = (LASintervalStartCell *)operator_new(0x20);
      LASintervalStartCell::LASintervalStartCell(this_00);
      number_intervals = cell_index;
      local_40 = this_00;
      pVar4 = std::
              _Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<int_const,LASintervalStartCell*>>
                        ((_Hashtable<int,std::pair<int_const,LASintervalStartCell*>,std::allocator<std::pair<int_const,LASintervalStartCell*>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)this->cells,&number_intervals);
      (**(code **)(*plVar2 + 0x18))(plVar2,&number_intervals,pVar4._8_8_);
      (**(code **)(*plVar2 + 0x18))(plVar2,&number_points);
      this_00->full = number_points;
      this_00->total = 0;
      pLVar3 = this_00;
      do {
        do {
          if (number_intervals == 0) {
            number_cells = number_cells - 1;
            goto LAB_00124ba1;
          }
          (**(code **)(*plVar2 + 0x18))(plVar2,pLVar3);
          (**(code **)(*plVar2 + 0x18))(plVar2,&(pLVar3->super_LASintervalCell).end);
          this_00->total =
               ((pLVar3->super_LASintervalCell).end - (pLVar3->super_LASintervalCell).start) +
               this_00->total + 1;
          number_intervals = number_intervals - 1;
        } while (number_intervals == 0);
        this_01 = (LASintervalStartCell *)operator_new(0x10);
        LASintervalCell::LASintervalCell((LASintervalCell *)this_01);
        (pLVar3->super_LASintervalCell).next = (LASintervalCell *)this_01;
        pLVar3 = this_01;
      } while( true );
    }
    sVar1 = 1;
  }
  else {
    laserror<char*>("(LASinterval): wrong signature %4s instead of \'LASV\'",signature);
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

BOOL LASinterval::read(ByteStreamIn* stream)
{
  char signature[4];
  try { stream->getBytes((U8*)signature, 4); } catch (...)
  {
    laserror("(LASinterval): reading signature");
    return FALSE;
  }
  if (strncmp(signature, "LASV", 4) != 0)
  {
    laserror("(LASinterval): wrong signature %4s instead of 'LASV'", signature);
    return FALSE;
  }
  U32 version;
  try { stream->get32bitsLE((U8*)&version); } catch (...)
  {
    laserror("(LASinterval): reading version");
    return FALSE;
  }
  // read number of cells
  U32 number_cells;
  try { stream->get32bitsLE((U8*)&number_cells); } catch (...)
  {
    laserror("(LASinterval): reading number of cells");
    return FALSE;
  }
  // loop over all cells
  while (number_cells)
  {
    // read index of cell
    I32 cell_index;
    try { stream->get32bitsLE((U8*)&cell_index); } catch (...)
    {
      laserror("(LASinterval): reading cell index");
      return FALSE;
    }
    // create cell and insert into hash
    LASintervalStartCell* start_cell = new LASintervalStartCell();
    ((my_cell_hash*)cells)->insert(my_cell_hash::value_type(cell_index, start_cell));
    LASintervalCell* cell = start_cell;
    // read number of intervals in cell
    U32 number_intervals;
    try { stream->get32bitsLE((U8*)&number_intervals); } catch (...)
    {
      laserror("(LASinterval): reading number of intervals in cell");
      return FALSE;
    }
    // read number of points in cell
    U32 number_points;
    try { stream->get32bitsLE((U8*)&number_points); } catch (...)
    {
      laserror("(LASinterval): reading number of points in cell");
      return FALSE;
    }
    start_cell->full = number_points;
    start_cell->total = 0;
    while (number_intervals)
    {
      // read start of interval
      try { stream->get32bitsLE((U8*)&(cell->start)); } catch (...)
      {
        laserror("(LASinterval): reading start %d of interval", cell->start);
        return FALSE;
      }
      // read end of interval
      try { stream->get32bitsLE((U8*)&(cell->end)); } catch (...)
      {
        laserror("(LASinterval): reading end %d of interval", cell->end);
        return FALSE;
      }
      start_cell->total += (cell->end - cell->start + 1);
      number_intervals--;
      if (number_intervals)
      {
        cell->next = new LASintervalCell();
        cell = cell->next;
      }
    }
    number_cells--;
  }

  return TRUE;
}